

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastZ64P2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ulong uVar1;
  char *pcVar2;
  uint *puVar3;
  
  if (data.field_0._0_2_ != 0) {
    pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar3 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar3 & 3) != 0) {
      AlignFail();
    }
    *puVar3 = *puVar3 | (uint)hasbits;
  }
  uVar1 = (long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30);
  if ((uVar1 & 7) == 0) {
    pcVar2 = EpsCopyInputStream::
             ReadPackedVarint<google::protobuf::internal::TcParser::PackedVarint<long,unsigned_short,true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(unsigned_long)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::TcParser::PackedVarint<long,unsigned_short,true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(unsigned_long)_1_>(char_const*,google::protobuf::internal::TcParser::PackedVarint<long,unsigned_short,true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(unsigned_long)_1_)::_lambda(int)_1_>
                       (&ctx->super_EpsCopyInputStream,ptr + 2,uVar1);
    return pcVar2;
  }
  AlignFail(uVar1);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastZ64P2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return PackedVarint<int64_t, uint16_t, true>(
      PROTOBUF_TC_PARAM_PASS);
}